

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

bool __thiscall
sptk::reaper::EpochTracker::GetBandpassedRmsSignal
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          float low_limit,float high_limit,float frame_interval,float frame_dur,
          vector<float,_std::allocator<float>_> *output_rms)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  size_type sVar6;
  ulong uVar7;
  float *x;
  FFT *y;
  reference pvVar8;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  EpochTracker *in_RDI;
  float in_XMM0_Da;
  double dVar9;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  size_t bframe;
  float rms;
  int32_t i_1;
  size_t i;
  size_t frame;
  size_t first_frame;
  float *im;
  float *re;
  int32_t last_bin;
  int32_t first_bin;
  int32_t fft_size;
  FFT ft;
  size_t n_frames;
  size_t frame_size;
  size_t frame_step;
  int in_stack_fffffffffffffedc;
  FFT *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  FFT *this_00;
  FFT *this_01;
  int offset;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff28;
  FILE *__stream;
  ulong local_c8;
  int local_bc;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  FFT local_70;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  vector<float,_std::allocator<float>_> *local_38;
  float local_2c;
  float local_24;
  float local_20;
  float local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  byte local_1;
  
  local_38 = in_RDX;
  local_2c = in_XMM4_Da;
  local_24 = in_XMM2_Da;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  iVar3 = RoundUp(in_XMM0_Da * in_XMM3_Da);
  local_40 = (ulong)iVar3;
  iVar3 = RoundUp(local_1c * local_2c);
  local_48 = (ulong)iVar3;
  sVar6 = std::vector<float,_std::allocator<float>_>::size(local_18);
  local_50 = (sVar6 - local_48) / local_40 + 1;
  if (local_50 < 2) {
    __stream = _stderr;
    sVar6 = std::vector<float,_std::allocator<float>_>::size(local_18);
    fprintf(__stream,"input too small (%d) in GetBandpassedRmsSignal\n",sVar6 & 0xffffffff);
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_ffffffffffffff00,
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_1 = 0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_ffffffffffffff00,
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    FFT::fft_pow2_from_window_size((int)local_48);
    this_01 = &local_70;
    FFT::FFT(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    iVar4 = FFT::get_fftSize(this_01);
    offset = iVar4;
    iVar3 = RoundUp(((float)iVar4 * local_20) / local_1c);
    iVar5 = RoundUp(((float)iVar4 * local_24) / local_1c);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar4;
    uVar7 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    x = (float *)operator_new__(uVar7);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iVar4;
    uVar7 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    y = (FFT *)operator_new__(uVar7);
    local_a8 = local_48 / (local_40 << 1);
    if (local_a8 * 2 * local_40 < local_48) {
      local_a8 = local_a8 + 1;
    }
    this_00 = y;
    for (local_b0 = local_a8; local_b0 < local_50; local_b0 = local_b0 + 1) {
      Window(in_RDI,in_stack_ffffffffffffff28,offset,(size_t)this_01,(float *)CONCAT44(iVar3,iVar5))
      ;
      for (local_b8 = 0; local_b8 < local_48; local_b8 = local_b8 + 1) {
        *(float *)((long)&y->fsine + local_b8 * 4) = 0.0;
      }
      for (local_bc = (int)local_48; local_bc < iVar4; local_bc = local_bc + 1) {
        *(float *)((long)&y->fsine + (long)local_bc * 4) = 0.0;
        x[local_bc] = 0.0;
      }
      FFT::fft(&local_70,x,(float *)y);
      in_stack_fffffffffffffefc =
           FFT::get_band_rms(this_00,(float *)CONCAT44(in_stack_fffffffffffffefc,
                                                       in_stack_fffffffffffffef8),
                             (float *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                             (int)in_stack_fffffffffffffee8);
      dVar9 = log10((double)in_stack_fffffffffffffefc + 1.0);
      in_stack_fffffffffffffef8 = (float)(dVar9 * 20.0);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](local_38,local_b0);
      *pvVar8 = in_stack_fffffffffffffef8;
      if (local_b0 == local_a8) {
        for (local_c8 = 0; local_c8 < local_a8; local_c8 = local_c8 + 1) {
          in_stack_fffffffffffffef4 = (float)(dVar9 * 20.0);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](local_38,local_c8);
          *pvVar8 = in_stack_fffffffffffffef4;
        }
      }
    }
    if (x != (float *)0x0) {
      operator_delete__(x);
    }
    if (y != (FFT *)0x0) {
      operator_delete__(y);
    }
    local_1 = 1;
    FFT::~FFT((FFT *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool EpochTracker::GetBandpassedRmsSignal(const std::vector<float>& input,
                                          float sample_rate,
                                          float low_limit, float high_limit,
                                          float frame_interval,
                                          float frame_dur,
                                          std::vector<float>* output_rms) {
  size_t frame_step = RoundUp(sample_rate * frame_interval);
  size_t frame_size = RoundUp(sample_rate * frame_dur);
  size_t n_frames = 1 + ((input.size() - frame_size) / frame_step);
  if (n_frames < 2) {
    fprintf(stderr, "input too small (%d) in GetBandpassedRmsSignal\n",
            static_cast<int>(input.size()));
    output_rms->resize(0);
    return false;
  }
  output_rms->resize(n_frames);
  FFT ft(FFT::fft_pow2_from_window_size(frame_size));
  int32_t fft_size = ft.get_fftSize();
  int32_t first_bin = RoundUp(fft_size * low_limit / sample_rate);
  int32_t last_bin = RoundUp(fft_size * high_limit / sample_rate);
  float* re = new float[fft_size];
  float* im = new float[fft_size];
  size_t first_frame = frame_size / (2 * frame_step);
  if ((first_frame * 2 * frame_step) < frame_size) {
    first_frame++;
  }
  for (size_t frame = first_frame; frame < n_frames; ++frame) {
    Window(input, (frame - first_frame) * frame_step, frame_size, re);
    for (size_t i = 0; i < frame_size; ++i) {
      im[i] = 0.0;
    }
    for (int32_t i = frame_size; i < fft_size; ++i) {
      re[i] = im[i] = 0.0;
    }
    ft.fft(re, im);
    float rms = 20.0 *
        log10(1.0 + ft.get_band_rms(re, im, first_bin, last_bin));
    (*output_rms)[frame] = rms;
    if (frame == first_frame) {
      for (size_t bframe = 0; bframe < first_frame; ++bframe) {
        (*output_rms)[bframe] = rms;
      }
    }
  }
  delete [] re;
  delete [] im;
  return true;
}